

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempExpression.cpp
# Opt level: O2

void __thiscall IRT::TempExpression::TempExpression(TempExpression *this,Temporary *temporary)

{
  (this->super_Expression).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__TempExpression_00161b40;
  std::__cxx11::string::string((string *)&this->temporary_,(string *)temporary);
  return;
}

Assistant:

IRT::TempExpression::TempExpression(IRT::Temporary temporary)
    : temporary_(std::move(temporary)) {}